

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int SaveEXRImageToFile(EXRImage *exr_image,EXRHeader *exr_header,char *filename,char **err)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  char *in_RDX;
  long in_RSI;
  long in_RDI;
  size_t written_size;
  size_t mem_size;
  uchar *mem;
  FILE *fp;
  char **in_stack_000007f0;
  uchar **in_stack_000007f8;
  EXRHeader *in_stack_00000800;
  EXRImage *in_stack_00000808;
  char **in_stack_fffffffffffffee8;
  allocator<char> *err_00;
  string *in_stack_fffffffffffffef0;
  string *msg;
  allocator<char> local_f1;
  string local_f0 [16];
  allocator<char> *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined1 local_b1 [33];
  FILE *local_90;
  allocator<char> local_81;
  string local_80 [55];
  allocator<char> local_49;
  string local_48 [68];
  int local_4;
  
  if (((in_RDI == 0) || (in_RDX == (char *)0x0)) || (*(int *)(in_RSI + 0x7c) < 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    tinyexr::SetErrorMessage(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator(&local_49);
    local_4 = -3;
  }
  else if (*(int *)(in_RSI + 0x7c) == 0x80) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    tinyexr::SetErrorMessage(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator(&local_81);
    local_4 = -10;
  }
  else {
    local_90 = fopen(in_RDX,"wb");
    if (local_90 == (FILE *)0x0) {
      msg = (string *)local_b1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      tinyexr::SetErrorMessage(msg,in_stack_fffffffffffffee8);
      std::__cxx11::string::~string((string *)(local_b1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_b1);
      local_4 = -0xb;
    }
    else {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               SaveEXRImageToMemory
                         (in_stack_00000808,in_stack_00000800,in_stack_000007f8,in_stack_000007f0);
      if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        fclose(local_90);
        local_4 = -0xc;
      }
      else {
        this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        free((void *)0x0);
        fclose(local_90);
        if (this == pbVar1) {
          local_4 = 0;
        }
        else {
          err_00 = &local_f1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (this,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
          tinyexr::SetErrorMessage(in_stack_fffffffffffffef0,(char **)err_00);
          std::__cxx11::string::~string(local_f0);
          std::allocator<char>::~allocator(&local_f1);
          local_4 = -0xb;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int SaveEXRImageToFile(const EXRImage *exr_image, const EXRHeader *exr_header,
                       const char *filename, const char **err) {
  if (exr_image == NULL || filename == NULL ||
      exr_header->compression_type < 0) {
    tinyexr::SetErrorMessage("Invalid argument for SaveEXRImageToFile", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

#if !TINYEXR_USE_PIZ
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
    tinyexr::SetErrorMessage("PIZ compression is not supported in this build",
                             err);
    return TINYEXR_ERROR_UNSUPPORTED_FEATURE;
  }
#endif

#if !TINYEXR_USE_ZFP
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
    tinyexr::SetErrorMessage("ZFP compression is not supported in this build",
                             err);
    return TINYEXR_ERROR_UNSUPPORTED_FEATURE;
  }
#endif

#ifdef _WIN32
  FILE *fp = NULL;
  fopen_s(&fp, filename, "wb");
#else
  FILE *fp = fopen(filename, "wb");
#endif
  if (!fp) {
    tinyexr::SetErrorMessage("Cannot write a file", err);
    return TINYEXR_ERROR_CANT_WRITE_FILE;
  }

  unsigned char *mem = NULL;
  size_t mem_size = SaveEXRImageToMemory(exr_image, exr_header, &mem, err);
  if (mem_size == 0) {
    fclose(fp);
    return TINYEXR_ERROR_SERIALZATION_FAILED;
  }

  size_t written_size = 0;
  if ((mem_size > 0) && mem) {
    written_size = fwrite(mem, 1, mem_size, fp);
  }
  free(mem);

  fclose(fp);

  if (written_size != mem_size) {
    tinyexr::SetErrorMessage("Cannot write a file", err);
    return TINYEXR_ERROR_CANT_WRITE_FILE;
  }

  return TINYEXR_SUCCESS;
}